

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharacterSet.cpp
# Opt level: O1

CharacterSet ZXing::CharacterSetFromString(string_view name)

{
  uint uVar1;
  bool bVar2;
  CharacterSet CVar3;
  char *in_RCX;
  CharacterSetName *__it;
  long lVar4;
  ulong uVar5;
  CharacterSetName *__it_00;
  string_view sv;
  uint *local_d0;
  long local_c8;
  undefined8 local_c0;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  uint *local_b0;
  long local_a8;
  uint local_a0;
  undefined4 uStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  uint *local_90;
  long local_88;
  long local_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  long *local_70;
  long local_68;
  long local_60 [2];
  string local_50;
  
  sv._M_str = in_RCX;
  sv._M_len = (size_t)name._M_str;
  NormalizeName_abi_cxx11_(&local_50,(ZXing *)name._M_len,sv);
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_50._M_dataplus._M_p,
             local_50._M_dataplus._M_p + local_50._M_string_length);
  local_b0 = &local_a0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_70,local_68 + (long)local_70);
  uVar1 = local_a0;
  local_88 = local_a8;
  if (local_b0 == &local_a0) {
    uStack_b8 = uStack_98;
    uStack_b4 = uStack_94;
    local_d0 = (uint *)&local_c0;
  }
  else {
    local_d0 = local_b0;
  }
  local_c0 = CONCAT44(uStack_9c,local_a0);
  local_c8 = local_a8;
  local_a8 = 0;
  local_a0 = local_a0 & 0xffffff00;
  local_90 = (uint *)&local_80;
  if (local_d0 == (uint *)&local_c0) {
    local_80 = CONCAT44(uStack_9c,uVar1);
    uStack_78 = uStack_b8;
    uStack_74 = uStack_b4;
  }
  else {
    local_90 = local_d0;
    local_80 = local_c0;
  }
  local_d0 = (uint *)&local_c0;
  local_b0 = &local_a0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d0,local_90,local_88 + (long)local_90);
  uVar5 = 0xb;
  lVar4 = 0x3f0;
  __it = (CharacterSetName *)&NAME_TO_CHARSET;
  do {
    __it_00 = __it;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)&local_d0,__it_00);
    __it = __it_00;
    if (bVar2) goto LAB_0013267a;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)&local_d0,__it_00 + 1);
    __it = __it_00 + 1;
    if (bVar2) goto LAB_0013267a;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)&local_d0,__it_00 + 2);
    __it = __it_00 + 2;
    if (bVar2) goto LAB_0013267a;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)&local_d0,__it_00 + 3);
    __it = __it_00 + 3;
    if (bVar2) goto LAB_0013267a;
    __it = __it_00 + 4;
    uVar5 = uVar5 - 1;
    lVar4 = lVar4 + -0x60;
  } while (1 < uVar5);
  lVar4 = (lVar4 >> 3) * -0x5555555555555555;
  if (lVar4 == 1) {
LAB_0013265f:
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)&local_d0,__it);
    if (bVar2) goto LAB_0013267a;
  }
  else {
    if (lVar4 == 2) {
LAB_00132645:
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::$_0>
              ::operator()((_Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::__0>
                            *)&local_d0,__it);
      if (bVar2) goto LAB_0013267a;
      __it = __it + 1;
      goto LAB_0013265f;
    }
    if (lVar4 == 3) {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::$_0>
              ::operator()((_Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::__0>
                            *)&local_d0,__it);
      if (bVar2) goto LAB_0013267a;
      __it = __it_00 + 5;
      goto LAB_00132645;
    }
  }
  __it = (CharacterSetName *)&PTR_typeinfo_001fc360;
LAB_0013267a:
  if (local_d0 != (uint *)&local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_90 != (uint *)&local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,CONCAT44(uStack_9c,local_a0) + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (__it == (CharacterSetName *)&PTR_typeinfo_001fc360) {
    CVar3 = Unknown;
  }
  else {
    CVar3 = __it->cs;
  }
  return CVar3;
}

Assistant:

CharacterSet CharacterSetFromString(std::string_view name)
{
	auto i = FindIf(NAME_TO_CHARSET, [str = NormalizeName(name)](auto& v) { return NormalizeName(v.name) == str; });
	return i == std::end(NAME_TO_CHARSET) ? CharacterSet::Unknown : i->cs;
}